

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool __thiscall
GenericTransactionSignatureChecker<CMutableTransaction>::CheckECDSASignature
          (GenericTransactionSignatureChecker<CMutableTransaction> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSigIn,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchPubKey,CScript *scriptCode,
          SigVersion sigversion)

{
  byte *pbVar1;
  long lVar2;
  int iVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  uint256 sighash;
  CPubKey pubkey;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CPubKey::Set<unsigned_char_const*>
            (&pubkey,(vchPubKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start,
             (vchPubKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  if (((pubkey.vch[0] & 0xfe) != 2) &&
     ((uVar4 = 0, 7 < pubkey.vch[0] || ((0xd0U >> (pubkey.vch[0] & 0x1f) & 1) == 0))))
  goto LAB_0042419d;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&vchSig,vchSigIn);
  if (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_0042414a:
    uVar4 = 0;
  }
  else {
    pbVar1 = vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    if ((sigversion == WITNESS_V0) && (this->amount < 0)) {
      HandleMissingData(this->m_mdb);
      goto LAB_0042414a;
    }
    SignatureHash<CMutableTransaction>
              (&sighash,scriptCode,this->txTo,this->nIn,(uint)*pbVar1,&this->amount,sigversion,
               this->txdata);
    iVar3 = (*(this->super_BaseSignatureChecker)._vptr_BaseSignatureChecker[6])
                      (this,&vchSig,&pubkey,&sighash);
    uVar4 = (undefined1)iVar3;
  }
  if (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0042419d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)uVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool GenericTransactionSignatureChecker<T>::CheckECDSASignature(const std::vector<unsigned char>& vchSigIn, const std::vector<unsigned char>& vchPubKey, const CScript& scriptCode, SigVersion sigversion) const
{
    CPubKey pubkey(vchPubKey);
    if (!pubkey.IsValid())
        return false;

    // Hash type is one byte tacked on to the end of the signature
    std::vector<unsigned char> vchSig(vchSigIn);
    if (vchSig.empty())
        return false;
    int nHashType = vchSig.back();
    vchSig.pop_back();

    // Witness sighashes need the amount.
    if (sigversion == SigVersion::WITNESS_V0 && amount < 0) return HandleMissingData(m_mdb);

    uint256 sighash = SignatureHash(scriptCode, *txTo, nIn, nHashType, amount, sigversion, this->txdata);

    if (!VerifyECDSASignature(vchSig, pubkey, sighash))
        return false;

    return true;
}